

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O3

int sptk::snack::init_dp_f0(double freq,F0_params *par,long *buffsize,long *sdstep,Buffer *buffer)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Frame *pFVar10;
  int *piVar11;
  float *pfVar12;
  Windstat *pWVar13;
  frame_rec *pfVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int iVar22;
  double dVar20;
  undefined1 auVar21 [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  int iVar30;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  fVar23 = par->trans_amp;
  buffer->tcost = par->trans_cost;
  buffer->tfact_a = fVar23;
  buffer->tfact_s = par->trans_spec;
  fVar23 = par->double_cost;
  buffer->vbias = par->voice_bias;
  buffer->fdouble = fVar23;
  uVar1 = par->frame_step;
  uVar4 = par->wind_dur;
  uVar17 = -(ulong)((double)(float)uVar1 * freq < 0.0);
  uVar18 = -(ulong)((double)(float)uVar4 * freq < 0.0);
  auVar27._0_8_ = ~uVar17 & 0x3fe0000000000000;
  auVar27._8_8_ = ~uVar18 & 0x3fe0000000000000;
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar17 & 0xbfe0000000000000;
  auVar8._12_4_ = (uint)(uVar18 >> 0x20) & 0xbfe00000;
  iVar26 = (int)(SUB168(auVar27 | auVar8,0) + (double)(float)uVar1 * freq);
  iVar30 = (int)(SUB168(auVar27 | auVar8,8) + (double)(float)uVar4 * freq);
  buffer->step = iVar26;
  buffer->size = iVar30;
  fVar23 = (float)((double)iVar26 / freq);
  buffer->frame_int = fVar23;
  buffer->wdur = (float)((double)iVar30 / freq);
  uVar2 = par->min_f0;
  uVar5 = par->max_f0;
  auVar28._8_8_ = freq;
  auVar28._0_8_ = freq;
  auVar9._8_4_ = SUB84((double)(float)uVar5,0);
  auVar9._0_8_ = (double)(float)uVar2;
  auVar9._12_4_ = (int)((ulong)(double)(float)uVar5 >> 0x20);
  auVar29 = divpd(auVar28,auVar9);
  uVar17 = -(ulong)(auVar29._8_8_ < 0.0);
  uVar18 = -(ulong)(auVar29._0_8_ < 0.0);
  auVar21._0_8_ = ~uVar17 & 0x3fe0000000000000;
  auVar21._8_8_ = ~uVar18 & 0x3fe0000000000000;
  auVar7._8_4_ = 0;
  auVar7._0_8_ = uVar17 & 0xbfe0000000000000;
  auVar7._12_4_ = (uint)(uVar18 >> 0x20) & 0xbfe00000;
  iVar19 = (int)(SUB168(auVar21 | auVar7,0) + auVar29._8_8_);
  iVar22 = (int)(SUB168(auVar21 | auVar7,8) + auVar29._0_8_);
  buffer->start = iVar19;
  buffer->stop = iVar22;
  iVar16 = (iVar22 - iVar19) + 1;
  buffer->nlags = iVar16;
  iVar30 = iVar22 + iVar30 + 1;
  buffer->ncomp = iVar30;
  buffer->maxpeaks = (short)(((iVar22 - iVar19) - (iVar16 >> 0x1f)) + 1U >> 1) + 2;
  buffer->ln2 = 0.6931472;
  dVar20 = (double)fVar23;
  auVar24._8_8_ = dVar20;
  auVar24._0_8_ = dVar20;
  auVar29 = divpd(_DAT_0012c5f0,auVar24);
  buffer->size_frame_hist = (int)auVar29._0_8_;
  buffer->size_frame_out = (int)auVar29._8_8_;
  uVar3 = par->lag_weight;
  uVar6 = par->freq_weight;
  auVar25._4_4_ = uVar3;
  auVar25._0_4_ = uVar6;
  auVar25._8_8_ = 0;
  auVar29._4_4_ = (float)iVar22;
  auVar29._0_4_ = fVar23;
  auVar29._8_4_ = (int)((ulong)((double)iVar26 / freq) >> 0x20);
  auVar29._12_4_ = (float)iVar22;
  auVar29 = divps(auVar25,auVar29);
  buffer->freqwt = (float)(int)auVar29._0_8_;
  buffer->lagwt = (float)(int)((ulong)auVar29._0_8_ >> 0x20);
  if (iVar30 < iVar26) {
    iVar19 = (int)(freq * 0.2) / iVar26;
  }
  else {
    iVar19 = ((int)(freq * 0.2) - iVar30) / iVar26 + 1;
  }
  iVar22 = ((int)(freq * 0.02) - (int)(freq * 0.03)) / 2 + (int)(freq * 0.03);
  if (iVar22 <= iVar30) {
    iVar22 = iVar30;
  }
  iVar22 = iVar22 + (((int)(freq * 0.005) - ((int)(freq * 0.005) + 1 >> 0x1f)) + 1 >> 1);
  buffer->pad = iVar22;
  *buffsize = (long)(iVar22 + iVar19 * iVar26);
  *sdstep = (long)(iVar19 * iVar26);
  buffer->size_cir_buffer = (int)(1.5 / dVar20);
  pFVar10 = alloc_frame(iVar16,par->n_cands);
  buffer->tailF = pFVar10;
  buffer->headF = pFVar10;
  iVar16 = buffer->size_cir_buffer;
  pfVar14 = pFVar10;
  if (1 < iVar16) {
    iVar30 = 1;
    do {
      pFVar10 = alloc_frame(buffer->nlags,par->n_cands);
      pfVar14 = buffer->headF;
      pfVar14->next = pFVar10;
      pFVar10->prev = pfVar14;
      buffer->headF = pFVar10;
      iVar30 = iVar30 + 1;
      iVar16 = buffer->size_cir_buffer;
    } while (iVar30 < iVar16);
    pfVar14 = buffer->tailF;
  }
  pFVar10->next = pfVar14;
  pfVar14->prev = pFVar10;
  buffer->headF = pfVar14;
  if (buffer->pcands == (int *)0x0) {
    piVar11 = (int *)ckalloc((long)par->n_cands << 2);
    buffer->pcands = piVar11;
    iVar16 = buffer->size_cir_buffer;
  }
  buffer->output_buf_size = iVar16;
  pfVar12 = (float *)ckalloc((long)iVar16 << 2);
  buffer->rms_speech = pfVar12;
  pfVar12 = (float *)ckalloc((long)buffer->output_buf_size << 2);
  buffer->f0p = pfVar12;
  pfVar12 = (float *)ckalloc((long)buffer->output_buf_size << 2);
  buffer->vuvp = pfVar12;
  pfVar12 = (float *)ckalloc((long)buffer->output_buf_size << 2);
  buffer->acpkp = pfVar12;
  pfVar12 = (float *)ckalloc((long)buffer->maxpeaks << 2);
  buffer->peaks = pfVar12;
  piVar11 = (int *)ckalloc((long)buffer->maxpeaks << 2);
  buffer->locs = piVar11;
  iVar16 = (int)(freq * 0.02) / buffer->step;
  buffer->wReuse = iVar16;
  if (iVar16 != 0) {
    pWVar13 = (Windstat *)ckalloc((long)iVar16 * 0x19c);
    buffer->windstat = pWVar13;
    iVar16 = buffer->wReuse;
    if (0 < (long)iVar16) {
      lVar15 = 0;
      do {
        *(undefined8 *)((long)&pWVar13->err + lVar15) = 0;
        lVar15 = lVar15 + 0x19c;
      } while ((long)iVar16 * 0x19c - lVar15 != 0);
    }
  }
  if (debug_level != 0) {
    init_dp_f0();
  }
  buffer->num_active_frames = 0;
  buffer->first_time = 1;
  return 0;
}

Assistant:

init_dp_f0(double freq, F0_params *par, long *buffsize, long *sdstep, Buffer *buffer)
{
  int nframes;
  int i;
  int stat_wsize, agap, ind, downpatch;
/*
 * reassigning some constants 
 */

  buffer->tcost = par->trans_cost;
  buffer->tfact_a = par->trans_amp;
  buffer->tfact_s = par->trans_spec;
  buffer->vbias = par->voice_bias;
  buffer->fdouble = par->double_cost;
  buffer->frame_int = par->frame_step;
  
  buffer->step = eround(buffer->frame_int * freq);
  buffer->size = eround(par->wind_dur * freq);
  buffer->frame_int = (float)(((float)buffer->step)/freq);
  buffer->wdur = (float)(((float)buffer->size)/freq);
  buffer->start = eround(freq / par->max_f0);
  buffer->stop = eround(freq / par->min_f0);
  buffer->nlags = buffer->stop - buffer->start + 1;
  buffer->ncomp = buffer->size + buffer->stop + 1; /* # of samples required by xcorr
			      comp. per fr. */
  buffer->maxpeaks = 2 + (buffer->nlags/2);	/* maximum number of "peaks" findable in ccf */
  buffer->ln2 = (float)log(2.0);
  buffer->size_frame_hist = (int) (DP_HIST / buffer->frame_int);
  buffer->size_frame_out = (int) (DP_LIMIT / buffer->frame_int);

/*
 * SET UP THE D.P. WEIGHTING FACTORS:
 *      The intent is to make the effectiveness of the various fudge factors
 *      independent of frame rate or sampling frequency.                
 */
  
  /* Lag-dependent weighting factor to emphasize early peaks (higher freqs)*/
  buffer->lagwt = par->lag_weight/buffer->stop;
  
  /* Penalty for a frequency skip in F0 per frame */
  buffer->freqwt = par->freq_weight/buffer->frame_int;
  
  i = (int) (READ_SIZE *freq);
  if(buffer->ncomp >= buffer->step) nframes = ((i-buffer->ncomp)/buffer->step ) + 1;
  else nframes = i / buffer->step;

  /* *buffsize is the number of samples needed to make F0 computation
     of nframes DP frames possible.  The last DP frame is patched with
     enough points so that F0 computation on it can be carried.  F0
     computaion on each frame needs enough points to do

     1) xcross or cross correlation measure:
           enough points to do xcross - ncomp

     2) stationarity measure:
           enough to make 30 msec windowing possible - ind

     3) downsampling:
           enough to make filtering possible -- downpatch
 
     So there are nframes whole DP frames, padded with pad points
     to make the last frame F0 computation ok.

  */

  /* last point in data frame needs points of 1/2 downsampler filter length 
     long, 0.005 is the filter length used in downsampler */
  downpatch = (((int) (freq * 0.005))+1) / 2;

  stat_wsize = (int) (STAT_WSIZE * freq);
  agap = (int) (STAT_AINT * freq);
  ind = ( agap - stat_wsize ) / 2;
  i = stat_wsize + ind;
  buffer->pad = downpatch + ((i>buffer->ncomp) ? i:buffer->ncomp);
  *buffsize = nframes * buffer->step + buffer->pad;
  *sdstep = nframes * buffer->step;
  
  /* Allocate space for the DP storage circularly linked data structure */

  buffer->size_cir_buffer = (int) (DP_CIRCULAR / buffer->frame_int);

  /* creating circularly linked data structures */
  buffer->tailF = alloc_frame(buffer->nlags, par->n_cands);
  buffer->headF = buffer->tailF;

  /* link them up */
  for(i=1; i<buffer->size_cir_buffer; i++){
    buffer->headF->next = alloc_frame(buffer->nlags, par->n_cands);
    buffer->headF->next->prev = buffer->headF;
    buffer->headF = buffer->headF->next;
  }
  buffer->headF->next = buffer->tailF;
  buffer->tailF->prev = buffer->headF;

  buffer->headF = buffer->tailF;

  /* Allocate sscratch array to use during backtrack convergence test. */
  if( ! buffer->pcands ) {
    buffer->pcands = (int *) ckalloc( par->n_cands * sizeof(int));
    /*    spsassert(pcands,"can't allocate pathcands");*/
  }

  /* Allocate arrays to return F0 and related signals. */

  /* Note: remember to compare *vecsize with size_frame_out, because
     size_cir_buffer is not constant */
  buffer->output_buf_size = buffer->size_cir_buffer;
  buffer->rms_speech = (float*)ckalloc(sizeof(float) * buffer->output_buf_size);
  /*  spsassert(rms_speech,"rms_speech ckalloc failed");*/
  buffer->f0p = (float*)ckalloc(sizeof(float) * buffer->output_buf_size);
  /*  spsassert(f0p,"f0p ckalloc failed");*/
  buffer->vuvp = (float*)ckalloc(sizeof(float)* buffer->output_buf_size);
  /*  spsassert(vuvp,"vuvp ckalloc failed");*/
  buffer->acpkp = (float*)ckalloc(sizeof(float) * buffer->output_buf_size);
  /*  spsassert(acpkp,"acpkp ckalloc failed");*/

  /* Allocate space for peak location and amplitude scratch arrays. */
  buffer->peaks = (float*)ckalloc(sizeof(float) * buffer->maxpeaks);
  /*  spsassert(peaks,"peaks ckalloc failed");*/
  buffer->locs = (int*)ckalloc(sizeof(int) * buffer->maxpeaks);
  /*  spsassert(locs, "locs ckalloc failed");*/
  
  /* Initialise the retrieval/saving scheme of window statistic measures */
  buffer->wReuse = agap / buffer->step;
  if (buffer->wReuse){
      buffer->windstat = (Windstat *) ckalloc( buffer->wReuse * sizeof(Windstat));
      /*      spsassert(windstat, "windstat ckalloc failed");*/
      for(i=0; i<buffer->wReuse; i++){
	  buffer->windstat[i].err = 0;
	  buffer->windstat[i].rms = 0;
      }
  }

  if(debug_level){
    Fprintf(stderr, "done with initialization:\n");
    Fprintf(stderr,
	    " size_cir_buffer:%d  xcorr frame size:%d start lag:%d nlags:%d\n",
	    buffer->size_cir_buffer, buffer->size, buffer->start, buffer->nlags);
  }

  buffer->num_active_frames = 0;
  buffer->first_time = 1;

  return(0);
}